

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_238a35::SndioCapture::open(SndioCapture *this,char *__file,int __oflag,...)

{
  int iVar1;
  ALuint AVar2;
  int iVar3;
  sio_hdl *psVar4;
  backend_exception *pbVar5;
  ALCchar *pAVar6;
  ALCchar *pAVar7;
  sio_par par;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff98;
  uint local_5c;
  int local_58;
  int local_54;
  undefined4 local_50;
  undefined4 local_4c;
  ALuint local_48;
  ALuint local_40;
  uint local_34;
  uint local_30;
  char *local_10;
  SndioCapture *local_8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = this;
  if (__file == (char *)0x0) {
    local_10 = "SndIO Default";
  }
  else {
    local_10 = __file;
    iVar1 = strcmp(__file,"SndIO Default");
    if (iVar1 != 0) {
      pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (pbVar5,0xa004,"Device name \"%s\" not found",local_10);
      __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
  }
  psVar4 = (sio_hdl *)sio_open(0,2,0);
  this->mSndHandle = psVar4;
  if (this->mSndHandle == (sio_hdl *)0x0) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar5,0xa004,"Could not open backend device");
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  sio_initpar(&local_5c);
  switch(((this->super_BackendBase).mDevice)->FmtType) {
  case DevFmtByte:
    local_58 = 1;
    local_54 = 1;
    break;
  case DevFmtUByte:
    local_58 = 1;
    local_54 = 0;
    break;
  case DevFmtShort:
    local_58 = 2;
    local_54 = 1;
    break;
  case DevFmtUShort:
    local_58 = 2;
    local_54 = 0;
    break;
  case DevFmtInt:
    local_58 = 4;
    local_54 = 1;
    break;
  case DevFmtUInt:
    local_58 = 4;
    local_54 = 0;
    break;
  case DevFmtFloat:
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar6 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"%s capture samples not supported",pAVar6);
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  local_5c = local_58 << 3;
  local_50 = 1;
  local_4c = 0;
  local_48 = ALCdevice::channelsFromFmt((ALCdevice *)0x23dc29);
  local_40 = ((this->super_BackendBase).mDevice)->Frequency;
  local_30 = maxu(((this->super_BackendBase).mDevice)->BufferSize,
                  ((this->super_BackendBase).mDevice)->Frequency / 10);
  local_34 = minu(local_30,((this->super_BackendBase).mDevice)->Frequency / 0x28);
  ((this->super_BackendBase).mDevice)->UpdateSize = local_34;
  ((this->super_BackendBase).mDevice)->BufferSize = local_30;
  iVar1 = sio_setpar(this->mSndHandle,&local_5c);
  if ((iVar1 == 0) || (iVar1 = sio_getpar(this->mSndHandle,&local_5c), iVar1 == 0)) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar5,0xa004,"Failed to set device praameters");
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  if (local_5c != local_58 << 3) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"Padded samples not supported (got %u of %u bits)",(ulong)local_5c,
               (ulong)(uint)(local_58 << 3));
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  if ((((((((((this->super_BackendBase).mDevice)->FmtType == DevFmtByte) && (local_5c == 8)) &&
          (local_54 != 0)) ||
         (((((this->super_BackendBase).mDevice)->FmtType == DevFmtUByte && (local_5c == 8)) &&
          (local_54 == 0)))) ||
        ((((((this->super_BackendBase).mDevice)->FmtType == DevFmtShort && (local_5c == 0x10)) &&
          (local_54 != 0)) ||
         (((((this->super_BackendBase).mDevice)->FmtType == DevFmtUShort && (local_5c == 0x10)) &&
          (local_54 == 0)))))) ||
       (((((this->super_BackendBase).mDevice)->FmtType == DevFmtInt && (local_5c == 0x20)) &&
        (local_54 != 0)))) ||
      (((((this->super_BackendBase).mDevice)->FmtType == DevFmtUInt && (local_5c == 0x20)) &&
       (local_54 == 0)))) &&
     ((AVar2 = ALCdevice::channelsFromFmt((ALCdevice *)0x23ded6), AVar2 == local_48 &&
      (((this->super_BackendBase).mDevice)->Frequency == local_40)))) {
    RingBuffer::Create(in_stack_ffffffffffffff98,(size_t)this,iVar3);
    std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator=
              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::~unique_ptr
              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    BackendBase::setDefaultChannelOrder
              ((BackendBase *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    iVar3 = std::__cxx11::string::operator=
                      ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_10);
    return iVar3;
  }
  pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
  pAVar6 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
  pAVar7 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
  al::backend_exception::backend_exception
            (pbVar5,0xa004,"Failed to set format %s %s %uhz, got %c%u %u-channel %uhz instead",
             pAVar6,pAVar7,(ulong)((this->super_BackendBase).mDevice)->Frequency,
             (local_54 == 0) + 0x73 + (uint)(local_54 == 0),local_5c,local_48,local_40);
  __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

void SndioCapture::open(const ALCchar *name)
{
    if(!name)
        name = sndio_device;
    else if(strcmp(name, sndio_device) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mSndHandle = sio_open(nullptr, SIO_REC, 0);
    if(mSndHandle == nullptr)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open backend device"};

    sio_par par;
    sio_initpar(&par);

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        par.bps = 1;
        par.sig = 1;
        break;
    case DevFmtUByte:
        par.bps = 1;
        par.sig = 0;
        break;
    case DevFmtShort:
        par.bps = 2;
        par.sig = 1;
        break;
    case DevFmtUShort:
        par.bps = 2;
        par.sig = 0;
        break;
    case DevFmtInt:
        par.bps = 4;
        par.sig = 1;
        break;
    case DevFmtUInt:
        par.bps = 4;
        par.sig = 0;
        break;
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }
    par.bits = par.bps * 8;
    par.le = SIO_LE_NATIVE;
    par.msb = SIO_LE_NATIVE ? 0 : 1;
    par.rchan = mDevice->channelsFromFmt();
    par.rate = mDevice->Frequency;

    par.appbufsz = maxu(mDevice->BufferSize, mDevice->Frequency/10);
    par.round = minu(par.appbufsz, mDevice->Frequency/40);

    mDevice->UpdateSize = par.round;
    mDevice->BufferSize = par.appbufsz;

    if(!sio_setpar(mSndHandle, &par) || !sio_getpar(mSndHandle, &par))
        throw al::backend_exception{ALC_INVALID_VALUE, "Failed to set device praameters"};

    if(par.bits != par.bps*8)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Padded samples not supported (got %u of %u bits)", par.bits, par.bps*8};

    if(!((mDevice->FmtType == DevFmtByte && par.bits == 8 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUByte && par.bits == 8 && par.sig == 0)
        || (mDevice->FmtType == DevFmtShort && par.bits == 16 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUShort && par.bits == 16 && par.sig == 0)
        || (mDevice->FmtType == DevFmtInt && par.bits == 32 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUInt && par.bits == 32 && par.sig == 0))
        || mDevice->channelsFromFmt() != par.rchan || mDevice->Frequency != par.rate)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set format %s %s %uhz, got %c%u %u-channel %uhz instead",
            DevFmtTypeString(mDevice->FmtType), DevFmtChannelsString(mDevice->FmtChans),
            mDevice->Frequency, par.sig?'s':'u', par.bits, par.rchan, par.rate};

    mRing = RingBuffer::Create(mDevice->BufferSize, par.bps*par.rchan, false);

    setDefaultChannelOrder();

    mDevice->DeviceName = name;
}